

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O1

uint64_t aom_sum_squares_i16_sse2(int16_t *src,uint32_t n)

{
  uint64_t uVar1;
  uint64_t uVar2;
  
  if ((n & 0x3f) == 0) {
    uVar1 = aom_sum_squares_i16_64n_sse2(src,n);
    return uVar1;
  }
  if (0x40 < n) {
    uVar1 = aom_sum_squares_i16_64n_sse2(src,n & 0xffffffc0);
    uVar2 = aom_sum_squares_i16_c(src + (n & 0xffffffc0),n & 0x3f);
    return uVar2 + uVar1;
  }
  uVar1 = aom_sum_squares_i16_c(src,n);
  return uVar1;
}

Assistant:

uint64_t aom_sum_squares_i16_sse2(const int16_t *src, uint32_t n) {
  if (n % 64 == 0) {
    return aom_sum_squares_i16_64n_sse2(src, n);
  } else if (n > 64) {
    const uint32_t k = n & ~63u;
    return aom_sum_squares_i16_64n_sse2(src, k) +
           aom_sum_squares_i16_c(src + k, n - k);
  } else {
    return aom_sum_squares_i16_c(src, n);
  }
}